

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::add_if_builtin
          (ActiveBuiltinHandler *this,uint32_t id,bool allow_blocks)

{
  size_t sVar1;
  bool bVar2;
  BuiltIn builtin;
  SPIRVariable *pSVar3;
  Meta *pMVar4;
  SPIRType *type;
  SPIRType *type_00;
  Bitset *decoration_flags;
  uint32_t i;
  uint32_t index;
  ulong uVar5;
  Bitset *this_00;
  
  pSVar3 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,id);
  pMVar4 = ParsedIR::find_meta(&this->compiler->ir,(ID)id);
  if (pMVar4 != (Meta *)0x0 && pSVar3 != (SPIRVariable *)0x0) {
    type = get<spirv_cross::SPIRType>
                     (this->compiler,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc);
    this_00 = &this->compiler->active_input_builtins + (type->storage != StorageClassInput);
    if ((pMVar4->decoration).builtin == true) {
      Bitset::set(this_00,(pMVar4->decoration).builtin_type);
      handle_builtin(this,type,(pMVar4->decoration).builtin_type,
                     &(pMVar4->decoration).decoration_flags);
      return;
    }
    if (allow_blocks) {
      bVar2 = ParsedIR::has_decoration
                        (&this->compiler->ir,(ID)(type->super_IVariant).self.id,DecorationBlock);
      if (bVar2) {
        sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                buffer_size;
        for (uVar5 = 0; (uint)sVar1 != uVar5; uVar5 = uVar5 + 1) {
          index = (uint32_t)uVar5;
          bVar2 = ParsedIR::has_member_decoration
                            (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationBuiltIn);
          if (bVar2) {
            type_00 = get<spirv_cross::SPIRType>
                                (this->compiler,
                                 (type->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [uVar5].id);
            builtin = ParsedIR::get_member_decoration
                                (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationBuiltIn);
            Bitset::set(this_00,builtin);
            decoration_flags =
                 ParsedIR::get_member_decoration_bitset
                           (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index);
            handle_builtin(this,type_00,builtin,decoration_flags);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::add_if_builtin(uint32_t id, bool allow_blocks)
{
	// Only handle plain variables here.
	// Builtins which are part of a block are handled in AccessChain.
	// If allow_blocks is used however, this is to handle initializers of blocks,
	// which implies that all members are written to.

	auto *var = compiler.maybe_get<SPIRVariable>(id);
	auto *m = compiler.ir.find_meta(id);
	if (var && m)
	{
		auto &type = compiler.get<SPIRType>(var->basetype);
		auto &decorations = m->decoration;
		auto &flags = type.storage == StorageClassInput ?
		              compiler.active_input_builtins : compiler.active_output_builtins;
		if (decorations.builtin)
		{
			flags.set(decorations.builtin_type);
			handle_builtin(type, decorations.builtin_type, decorations.decoration_flags);
		}
		else if (allow_blocks && compiler.has_decoration(type.self, DecorationBlock))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (compiler.has_member_decoration(type.self, i, DecorationBuiltIn))
				{
					auto &member_type = compiler.get<SPIRType>(type.member_types[i]);
					BuiltIn builtin = BuiltIn(compiler.get_member_decoration(type.self, i, DecorationBuiltIn));
					flags.set(builtin);
					handle_builtin(member_type, builtin, compiler.get_member_decoration_bitset(type.self, i));
				}
			}
		}
	}
}